

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

void __thiscall ast::UniaryOp::UniaryOp(UniaryOp *this,Token *t,int p,int a,int line)

{
  TokenType TVar1;
  pointer pcVar2;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  TVar1 = t->Type;
  pcVar2 = (t->Literal)._M_dataplus._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (t->Literal)._M_string_length);
  (this->super_Op).super_Expr.super_Node.lineno = line;
  (this->super_Op).super_Expr.super_Node.type_value = UniaryOpType;
  (this->super_Op).super_Expr.super_Node._vptr_Node = (_func_int **)&PTR__Op_00125918;
  (this->super_Op).tok._vptr_Token = (_func_int **)&PTR__Token_001258b0;
  (this->super_Op).tok.Type = TVar1;
  (this->super_Op).tok.Literal._M_dataplus._M_p = (pointer)&(this->super_Op).tok.Literal.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Op).tok.Literal,local_50,local_48 + (long)local_50);
  (this->super_Op).precedence = p;
  (this->super_Op).associative = a;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  (this->super_Op).super_Expr.super_Node._vptr_Node = (_func_int **)&PTR__UniaryOp_00125948;
  this->RightOp = (Expr *)0x0;
  return;
}

Assistant:

UniaryOp(Token &t, int p, int a , int line)
        :Op(t, p, a, line, NodeType::UniaryOpType), RightOp{nullptr} {}